

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  int iVar1;
  ossl_gost_imit_ctx *c;
  long lVar2;
  size_t sVar3;
  
  c = (ossl_gost_imit_ctx *)EVP_MD_CTX_get0_md_data();
  if (c->key_set == 0) {
    ERR_GOST_error(0x73,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                   ,0x5fc);
    return 0;
  }
  iVar1 = c->bytes_left;
  lVar2 = (long)iVar1;
  if (lVar2 != 0) {
    for (sVar3 = 0; (lVar2 + sVar3 < 8 && (count != sVar3)); sVar3 = sVar3 + 1) {
      c->partial_block[sVar3 + lVar2] = *(uchar *)((long)data + sVar3);
    }
    if (lVar2 + sVar3 != 8) {
      c->bytes_left = iVar1 + (int)sVar3;
      return 1;
    }
    data = (void *)((long)data + sVar3);
    count = count - sVar3;
    mac_block_mesh(c,c->partial_block);
  }
  for (; 8 < count; count = count - 8) {
    mac_block_mesh(c,(uchar *)data);
    data = (void *)((long)data + 8);
  }
  if (count != 0) {
    memcpy(c->partial_block,data,count);
  }
  c->bytes_left = (int)count;
  return 1;
}

Assistant:

static int gost_imit_update(EVP_MD_CTX *ctx, const void *data, size_t count)
{
    struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
    const unsigned char *p = data;
    size_t bytes = count;
    if (!(c->key_set)) {
        GOSTerr(GOST_F_GOST_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    if (c->bytes_left) {
        size_t i;
        for (i = c->bytes_left; i < 8 && bytes > 0; bytes--, i++, p++) {
            c->partial_block[i] = *p;
        }
        if (i == 8) {
            mac_block_mesh(c, c->partial_block);
        } else {
            c->bytes_left = i;
            return 1;
        }
    }
    while (bytes > 8) {
        mac_block_mesh(c, p);
        p += 8;
        bytes -= 8;
    }
    if (bytes > 0) {
        memcpy(c->partial_block, p, bytes);
    }
    c->bytes_left = bytes;
    return 1;
}